

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_matrix_zp_chain_barcode.cpp
# Opt level: O2

void Chain_matrix_zp_barcode_column_removal_invoker::
     run<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
               (type<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
                *param_1)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  Chain_matrix_zp_barcode_column_removal<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
  t;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  basic_wrap_stringstream<char> local_208;
  pointer local_70;
  pointer local_68;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  pointer local_30;
  pointer local_28;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_matrix_zp_chain_barcode.cpp"
  ;
  local_210 = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"Chain_matrix_zp_barcode_column_removal");
  std::operator<<((ostream *)&local_208,"\" fixture ctor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_30 = (pbVar2->_M_dataplus)._M_p;
  local_28 = local_30 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_218,0x47);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_matrix_zp_chain_barcode.cpp"
  ;
  local_220 = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"Chain_matrix_zp_barcode_column_removal");
  std::operator<<((ostream *)&local_208,"\" fixture setup");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_40 = (pbVar2->_M_dataplus)._M_p;
  local_38 = local_40 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_228,0x47);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_matrix_zp_chain_barcode.cpp"
  ;
  local_230 = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"Chain_matrix_zp_barcode_column_removal");
  std::operator<<((ostream *)&local_208,"\" test entry");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_50 = (pbVar2->_M_dataplus)._M_p;
  local_48 = local_50 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_238,0x47);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  Chain_matrix_zp_barcode_column_removal<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
  ::test_method(&t);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_matrix_zp_chain_barcode.cpp"
  ;
  local_240 = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"Chain_matrix_zp_barcode_column_removal");
  std::operator<<((ostream *)&local_208,"\" fixture teardown");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_60 = (pbVar2->_M_dataplus)._M_p;
  local_58 = local_60 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_248,0x47);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_matrix_zp_chain_barcode.cpp"
  ;
  local_250 = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"Chain_matrix_zp_barcode_column_removal");
  std::operator<<((ostream *)&local_208,"\" fixture dtor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_70 = (pbVar2->_M_dataplus)._M_p;
  local_68 = local_70 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_258,0x47);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(Chain_matrix_zp_barcode_column_removal, Matrix, removable_columns_matrices) {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);
  test_chain_maximal_simplex_removal<Matrix>(m);
}